

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>_>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>_> *this,format_specs *specs,
          padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
          *f)

{
  char *pcVar1;
  ulong __n;
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
  *this_00;
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
  *in_RDX;
  int *in_RSI;
  char **in_RDI;
  size_t left_padding;
  size_t padding;
  char_type fill;
  checked_ptr<typename_buffer<char>::value_type> *it;
  size_t num_code_points;
  size_t size;
  uint width;
  size_t in_stack_ffffffffffffff88;
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
  *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  char cVar2;
  checked_ptr<typename_buffer<char>::value_type> pcStack_48;
  checked_ptr<typename_buffer<char>::value_type> *ppcStack_40;
  checked_ptr<typename_buffer<char>::value_type> pcStack_38;
  basic_writer<duckdb_fmt::v6::buffer_range<char>_> *pbStack_30;
  basic_writer<duckdb_fmt::v6::buffer_range<char>_> *pbStack_28;
  type tStack_1c;
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
  *ppStack_18;
  int *piStack_10;
  
  ppStack_18 = in_RDX;
  piStack_10 = in_RSI;
  tStack_1c = to_unsigned<int>(*in_RSI);
  pbStack_30 = (basic_writer<duckdb_fmt::v6::buffer_range<char>_> *)
               padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
               ::size(ppStack_18);
  pbStack_28 = pbStack_30;
  if (tStack_1c != 0) {
    pbStack_30 = (basic_writer<duckdb_fmt::v6::buffer_range<char>_> *)
                 padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
                 ::width(ppStack_18);
  }
  if (pbStack_30 < (basic_writer<duckdb_fmt::v6::buffer_range<char>_> *)(ulong)tStack_1c) {
    pcStack_48 = reserve(pbStack_30,in_stack_ffffffffffffff88);
    ppcStack_40 = &pcStack_48;
    pcVar1 = fill_t<char>::operator[]((fill_t<char> *)((long)piStack_10 + 10),0);
    cVar2 = *pcVar1;
    __n = (ulong)tStack_1c - (long)pbStack_30;
    if ((*(byte *)((long)piStack_10 + 9) & 0xf) == 2) {
      pcVar1 = std::fill_n<char_*,_unsigned_long,_char>
                         ((char *)CONCAT17(cVar2,in_stack_ffffffffffffffb0),__n,
                          (char *)in_stack_ffffffffffffffa0);
      *ppcStack_40 = pcVar1;
      padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
      ::operator()<char_*&>(in_stack_ffffffffffffffa0,in_RDI);
    }
    else if ((*(byte *)((long)piStack_10 + 9) & 0xf) == 3) {
      this_00 = (padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
                 *)(__n >> 1);
      pcVar1 = std::fill_n<char_*,_unsigned_long,_char>
                         ((char *)CONCAT17(cVar2,in_stack_ffffffffffffffb0),__n,(char *)this_00);
      *ppcStack_40 = pcVar1;
      padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
      ::operator()<char_*&>(this_00,in_RDI);
      pcVar1 = std::fill_n<char_*,_unsigned_long,_char>
                         ((char *)CONCAT17(cVar2,in_stack_ffffffffffffffb0),__n,(char *)this_00);
      *ppcStack_40 = pcVar1;
    }
    else {
      padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
      ::operator()<char_*&>(in_stack_ffffffffffffffa0,in_RDI);
      pcVar1 = std::fill_n<char_*,_unsigned_long,_char>
                         ((char *)CONCAT17(cVar2,in_stack_ffffffffffffffb0),__n,
                          (char *)in_stack_ffffffffffffffa0);
      *ppcStack_40 = pcVar1;
    }
  }
  else {
    pcStack_38 = reserve(pbStack_30,(size_t)ppStack_18);
    padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
    ::operator()<char_*>(in_stack_ffffffffffffffa0,in_RDI);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }